

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O0

char * HdmiCec::GetOpCodeString(OpCode opCode)

{
  char *pcStack_10;
  OpCode opCode_local;
  
  switch(opCode) {
  case OpCode_FeatureAbort:
    pcStack_10 = "FeatureAbort";
    break;
  default:
    pcStack_10 = "Invalid";
    break;
  case OpCode_ImageViewOn:
    pcStack_10 = "ImageViewOn";
    break;
  case OpCode_TunerStepIncrement:
    pcStack_10 = "TunerStepIncrement";
    break;
  case OpCode_TunerStepDecrement:
    pcStack_10 = "TunerStepDecrement";
    break;
  case OpCode_TunerDeviceStatus:
    pcStack_10 = "TunerDeviceStatus";
    break;
  case OpCode_GiveTunerDeviceStatus:
    pcStack_10 = "GiveTunerDeviceStatus";
    break;
  case OpCode_RecordOn:
    pcStack_10 = "RecordOn";
    break;
  case OpCode_RecordStatus:
    pcStack_10 = "RecordStatus";
    break;
  case OpCode_RecordOff:
    pcStack_10 = "RecordOff";
    break;
  case OpCode_TextViewOn:
    pcStack_10 = "TextViewOn";
    break;
  case OpCode_RecordTvScreen:
    pcStack_10 = "RecordTvScreen";
    break;
  case OpCode_GiveDeckStatus:
    pcStack_10 = "GiveDeckStatus";
    break;
  case OpCode_DeckStatus:
    pcStack_10 = "DeckStatus";
    break;
  case OpCode_SetMenuLanguage:
    pcStack_10 = "SetMenuLanguage";
    break;
  case OpCode_ClearAnalogueTimer:
    pcStack_10 = "ClearAnalogueTimer";
    break;
  case OpCode_SetAnalogueTimer:
    pcStack_10 = "SetAnalogueTimer";
    break;
  case OpCode_TimerStatus:
    pcStack_10 = "TimerStatus";
    break;
  case OpCode_Standby:
    pcStack_10 = "Standby";
    break;
  case OpCode_Play:
    pcStack_10 = "Play";
    break;
  case OpCode_DeckControl:
    pcStack_10 = "DeckControl";
    break;
  case OpCode_TimerClearedStatus:
    pcStack_10 = "TimerClearedStatus";
    break;
  case OpCode_UserControlPressed:
    pcStack_10 = "UserControlPressed";
    break;
  case OpCode_UserControlReleased:
    pcStack_10 = "UserControlReleased";
    break;
  case OpCode_GiveOsdName:
    pcStack_10 = "GiveOsdName";
    break;
  case OpCode_SetOsdName:
    pcStack_10 = "SetOsdName";
    break;
  case OpCode_SetOsdString:
    pcStack_10 = "SetOsdString";
    break;
  case OpCode_SetTimerProgramTitle:
    pcStack_10 = "SetTimerProgramTitle";
    break;
  case OpCode_SystemAudioModeRequest:
    pcStack_10 = "SystemAudioModeRequest";
    break;
  case OpCode_GiveAudioStatus:
    pcStack_10 = "GiveAudioStatus";
    break;
  case OpCode_SetSystemAudioMode:
    pcStack_10 = "SetSystemAudioMode";
    break;
  case OpCode_ReportAudioStatus:
    pcStack_10 = "ReportAudioStatus";
    break;
  case OpCode_GiveSystemAudioModeStatus:
    pcStack_10 = "GiveSystemAudioModeStatus";
    break;
  case OpCode_SystemAudioModeStatus:
    pcStack_10 = "SystemAudioModeStatus";
    break;
  case OpCode_RoutingChange:
    pcStack_10 = "RoutingChange";
    break;
  case OpCode_RoutingInformation:
    pcStack_10 = "RoutingInformation";
    break;
  case OpCode_ActiveSource:
    pcStack_10 = "ActiveSource";
    break;
  case OpCode_GivePhysicalAddress:
    pcStack_10 = "GivePhysicalAddress";
    break;
  case OpCode_ReportPhysicalAddress:
    pcStack_10 = "ReportPhysicalAddress";
    break;
  case OpCode_RequestActiveSource:
    pcStack_10 = "RequestActiveSource";
    break;
  case OpCode_SetStreamPath:
    pcStack_10 = "SetStreamPath";
    break;
  case OpCode_DeviceVendorId:
    pcStack_10 = "DeviceVendorId";
    break;
  case OpCode_VendorCommand:
    pcStack_10 = "VendorCommand";
    break;
  case OpCode_VendorRemoteButtonDown:
    pcStack_10 = "VendorRemoteButtonDown";
    break;
  case OpCode_VendorRemoteButtonUp:
    pcStack_10 = "VendorRemoteButtonUp";
    break;
  case OpCode_GiveDeviceVendorId:
    pcStack_10 = "GiveDeviceVendorId";
    break;
  case OpCode_MenuRequest:
    pcStack_10 = "MenuRequest";
    break;
  case OpCode_MenuStatus:
    pcStack_10 = "MenuStatus";
    break;
  case OpCode_GiveDevicePowerStatus:
    pcStack_10 = "GiveDevicePowerStatus";
    break;
  case OpCode_ReportPowerStatus:
    pcStack_10 = "ReportPowerStatus";
    break;
  case OpCode_GetMenuLanguage:
    pcStack_10 = "GetMenuLanguage";
    break;
  case OpCode_SelectAnalogueService:
    pcStack_10 = "SelectAnalogueService";
    break;
  case OpCode_SelectDigitalService:
    pcStack_10 = "SelectDigitalService";
    break;
  case OpCode_SetDigitalTimer:
    pcStack_10 = "SetDigitalTimer";
    break;
  case OpCode_ClearDigitalTimer:
    pcStack_10 = "ClearDigitalTimer";
    break;
  case OpCode_SetAudioRate:
    pcStack_10 = "SetAudioRate";
    break;
  case OpCode_InactiveSource:
    pcStack_10 = "InactiveSource";
    break;
  case OpCode_CecVersion:
    pcStack_10 = "CecVersion";
    break;
  case OpCode_GetCecVersion:
    pcStack_10 = "GetCecVersion";
    break;
  case OpCode_VendorCommandWithId:
    pcStack_10 = "VendorCommandWithId";
    break;
  case OpCode_ClearExternalTimer:
    pcStack_10 = "ClearExternalTimer";
    break;
  case OpCode_SetExternalTimer:
    pcStack_10 = "SetExternalTimer";
    break;
  case OpCode_ReportShortAudioDescriptor:
    pcStack_10 = "ReportShortAudioDescriptor";
    break;
  case OpCode_RequestShortAudioDescriptor:
    pcStack_10 = "RequestShortAudioDescriptor";
    break;
  case OpCode_GiveFeatures:
    pcStack_10 = "GiveFeatures";
    break;
  case OpCode_ReportFeatures:
    pcStack_10 = "ReportFeatures";
    break;
  case OpCode_RequestCurrentLatency:
    pcStack_10 = "RequestCurrentLatency";
    break;
  case OpCode_ReportCurrentLatency:
    pcStack_10 = "ReportCurrentLatency";
    break;
  case OpCode_InitiateArc:
    pcStack_10 = "InitiateArc";
    break;
  case OpCode_ReportArcInitiated:
    pcStack_10 = "ReportArcInitiated";
    break;
  case OpCode_ReportArcTerminated:
    pcStack_10 = "ReportArcTerminated";
    break;
  case OpCode_RequestArcInitiation:
    pcStack_10 = "RequestArcInitiation";
    break;
  case OpCode_RequestArcTermination:
    pcStack_10 = "RequestArcTermination";
    break;
  case OpCode_TerminateArc:
    pcStack_10 = "TerminateArc";
    break;
  case OpCode_CDCMessage:
    pcStack_10 = "CDCMessage";
    break;
  case OpCode_Abort:
    pcStack_10 = "Abort";
  }
  return pcStack_10;
}

Assistant:

const char* GetOpCodeString( OpCode opCode )
    {
        switch( opCode )
        {
        case OpCode_ActiveSource:
            return "ActiveSource";
        case OpCode_ImageViewOn:
            return "ImageViewOn";
        case OpCode_TextViewOn:
            return "TextViewOn";
        case OpCode_InactiveSource:
            return "InactiveSource";
        case OpCode_RequestActiveSource:
            return "RequestActiveSource";
        case OpCode_RoutingChange:
            return "RoutingChange";
        case OpCode_RoutingInformation:
            return "RoutingInformation";
        case OpCode_SetStreamPath:
            return "SetStreamPath";
        case OpCode_Standby:
            return "Standby";
        case OpCode_RecordOff:
            return "RecordOff";
        case OpCode_RecordOn:
            return "RecordOn";
        case OpCode_RecordStatus:
            return "RecordStatus";
        case OpCode_RecordTvScreen:
            return "RecordTvScreen";
        case OpCode_ClearAnalogueTimer:
            return "ClearAnalogueTimer";
        case OpCode_ClearDigitalTimer:
            return "ClearDigitalTimer";
        case OpCode_ClearExternalTimer:
            return "ClearExternalTimer";
        case OpCode_SetAnalogueTimer:
            return "SetAnalogueTimer";
        case OpCode_SetDigitalTimer:
            return "SetDigitalTimer";
        case OpCode_SetExternalTimer:
            return "SetExternalTimer";
        case OpCode_SetTimerProgramTitle:
            return "SetTimerProgramTitle";
        case OpCode_TimerClearedStatus:
            return "TimerClearedStatus";
        case OpCode_TimerStatus:
            return "TimerStatus";
        case OpCode_CecVersion:
            return "CecVersion";
        case OpCode_GetCecVersion:
            return "GetCecVersion";
        case OpCode_GivePhysicalAddress:
            return "GivePhysicalAddress";
        case OpCode_GetMenuLanguage:
            return "GetMenuLanguage";
        case OpCode_ReportPhysicalAddress:
            return "ReportPhysicalAddress";
        case OpCode_SetMenuLanguage:
            return "SetMenuLanguage";
        case OpCode_DeckControl:
            return "DeckControl";
        case OpCode_DeckStatus:
            return "DeckStatus";
        case OpCode_GiveDeckStatus:
            return "GiveDeckStatus";
        case OpCode_Play:
            return "Play";
        case OpCode_GiveTunerDeviceStatus:
            return "GiveTunerDeviceStatus";
        case OpCode_SelectAnalogueService:
            return "SelectAnalogueService";
        case OpCode_SelectDigitalService:
            return "SelectDigitalService";
        case OpCode_TunerDeviceStatus:
            return "TunerDeviceStatus";
        case OpCode_TunerStepDecrement:
            return "TunerStepDecrement";
        case OpCode_TunerStepIncrement:
            return "TunerStepIncrement";
        case OpCode_DeviceVendorId:
            return "DeviceVendorId";
        case OpCode_GiveDeviceVendorId:
            return "GiveDeviceVendorId";
        case OpCode_VendorCommand:
            return "VendorCommand";
        case OpCode_VendorCommandWithId:
            return "VendorCommandWithId";
        case OpCode_VendorRemoteButtonDown:
            return "VendorRemoteButtonDown";
        case OpCode_VendorRemoteButtonUp:
            return "VendorRemoteButtonUp";
        case OpCode_SetOsdString:
            return "SetOsdString";
        case OpCode_GiveOsdName:
            return "GiveOsdName";
        case OpCode_SetOsdName:
            return "SetOsdName";
        case OpCode_MenuRequest:
            return "MenuRequest";
        case OpCode_MenuStatus:
            return "MenuStatus";
        case OpCode_UserControlPressed:
            return "UserControlPressed";
        case OpCode_UserControlReleased:
            return "UserControlReleased";
        case OpCode_GiveDevicePowerStatus:
            return "GiveDevicePowerStatus";
        case OpCode_ReportPowerStatus:
            return "ReportPowerStatus";
        case OpCode_FeatureAbort:
            return "FeatureAbort";
        case OpCode_Abort:
            return "Abort";
        case OpCode_GiveAudioStatus:
            return "GiveAudioStatus";
        case OpCode_GiveSystemAudioModeStatus:
            return "GiveSystemAudioModeStatus";
        case OpCode_ReportAudioStatus:
            return "ReportAudioStatus";
        case OpCode_SetSystemAudioMode:
            return "SetSystemAudioMode";
        case OpCode_SystemAudioModeRequest:
            return "SystemAudioModeRequest";
        case OpCode_SystemAudioModeStatus:
            return "SystemAudioModeStatus";
        case OpCode_SetAudioRate:
            return "SetAudioRate";
        case OpCode_ReportShortAudioDescriptor:
            return "ReportShortAudioDescriptor";
        case OpCode_RequestShortAudioDescriptor:
            return "RequestShortAudioDescriptor";
        case OpCode_GiveFeatures:
            return "GiveFeatures";
        case OpCode_ReportFeatures:
            return "ReportFeatures";
        case OpCode_RequestCurrentLatency:
            return "RequestCurrentLatency";
        case OpCode_ReportCurrentLatency:
            return "ReportCurrentLatency";
        case OpCode_InitiateArc:
            return "InitiateArc";
        case OpCode_ReportArcInitiated:
            return "ReportArcInitiated";
        case OpCode_ReportArcTerminated:
            return "ReportArcTerminated";
        case OpCode_RequestArcInitiation:
            return "RequestArcInitiation";
        case OpCode_RequestArcTermination:
            return "RequestArcTermination";
        case OpCode_TerminateArc:
            return "TerminateArc";
        case OpCode_CDCMessage:
            return "CDCMessage";
        default:
            break;
        }
        return "Invalid";
    }